

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O0

void process_msg(int is_client,quicly_conn_t **conns,msghdr *msg,size_t dgram_len)

{
  int iVar1;
  size_t sVar2;
  long in_RCX;
  quicly_decoded_packet_t *in_RDX;
  sockaddr *in_RSI;
  int in_EDI;
  quicly_conn_t *unaff_retaddr;
  quicly_decoded_packet_t decoded;
  size_t i;
  size_t off;
  quicly_decoded_packet_t *in_stack_ffffffffffffff40;
  sockaddr *in_stack_ffffffffffffff48;
  sockaddr *in_stack_ffffffffffffff50;
  quicly_conn_t *in_stack_ffffffffffffff58;
  long local_30;
  undefined4 in_stack_fffffffffffffff8;
  
  while ((in_RCX != 0 &&
         (sVar2 = quicly_decode_packet
                            ((quicly_context_t *)decoded.cid.dest.plaintext.node_id,
                             (quicly_decoded_packet_t *)decoded.cid.dest.plaintext._0_8_,
                             (uint8_t *)decoded.cid.dest.encrypted.len,
                             (size_t)decoded.cid.dest.encrypted.base,(size_t *)decoded.octets.len),
         sVar2 != 0xffffffffffffffff))) {
    local_30 = 0;
    while ((*(long *)(in_RSI->sa_data + local_30 * 8 + -2) != 0 &&
           (iVar1 = quicly_is_destination
                              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40), iVar1 == 0))) {
      local_30 = local_30 + 1;
    }
    if (*(long *)(in_RSI->sa_data + local_30 * 8 + -2) == 0) {
      if (in_EDI == 0) {
        in_stack_ffffffffffffff40 = (quicly_decoded_packet_t *)0x0;
        quicly_accept((quicly_conn_t **)decoded.token.base,(quicly_context_t *)decoded._72_8_,
                      (sockaddr *)decoded.cid.src.len,(sockaddr *)decoded.cid.src.base,
                      (quicly_decoded_packet_t *)decoded.cid.dest._32_8_,
                      (quicly_address_token_plaintext_t *)decoded.cid.dest.plaintext.node_id,
                      (quicly_cid_plaintext_t *)decoded.encrypted_off,
                      (ptls_handshake_properties_t *)decoded.datagram_size);
      }
    }
    else {
      quicly_receive(unaff_retaddr,(sockaddr *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_RSI,
                     in_RDX);
    }
  }
  return;
}

Assistant:

static void process_msg(int is_client, quicly_conn_t **conns, struct msghdr *msg, size_t dgram_len)
{
    size_t off = 0, i;

    /* split UDP datagram into multiple QUIC packets */
    while (off < dgram_len) {
        quicly_decoded_packet_t decoded;
        if (quicly_decode_packet(&ctx, &decoded, msg->msg_iov[0].iov_base, dgram_len, &off) == SIZE_MAX)
            return;
        /* find the corresponding connection (TODO handle version negotiation, rebinding, retry, etc.) */
        for (i = 0; conns[i] != NULL; ++i)
            if (quicly_is_destination(conns[i], NULL, msg->msg_name, &decoded))
                break;
        if (conns[i] != NULL) {
            /* let the current connection handle ingress packets */
            quicly_receive(conns[i], NULL, msg->msg_name, &decoded);
        } else if (!is_client) {
            /* assume that the packet is a new connection */
            quicly_accept(conns + i, &ctx, NULL, msg->msg_name, &decoded, NULL, &next_cid, NULL);
        }
    }
}